

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                       xmlRelaxNGDefinePtr_conflict parent)

{
  uint uVar1;
  xmlRelaxNGDefinePtr_conflict def;
  xmlRelaxNGType xVar2;
  int iVar3;
  xmlRelaxNGParserCtxtPtr pxVar4;
  xmlRelaxNGParserCtxtPtr pxVar5;
  xmlRelaxNGParserCtxtPtr in_RCX;
  xmlRelaxNGDefinePtr_conflict pxVar6;
  xmlRelaxNGParserCtxtPtr parent_00;
  
  parent_00 = (xmlRelaxNGParserCtxtPtr)0x0;
  do {
    if ((xmlRelaxNGParserCtxtPtr)cur == (xmlRelaxNGParserCtxtPtr)0x0) {
      return;
    }
    xVar2 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
    pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
    if (xVar2 == XML_RELAXNG_EMPTY) {
      ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
      if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
        uVar1 = parent->type + ~XML_RELAXNG_OPTIONAL;
        in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)uVar1;
        if (uVar1 < 2) {
LAB_00174ad9:
          xVar2 = XML_RELAXNG_EMPTY;
LAB_00174adb:
          parent->type = xVar2;
          return;
        }
        if ((parent->type & ~XML_RELAXNG_NOT_ALLOWED) != XML_RELAXNG_GROUP) goto LAB_00174acb;
LAB_00174ab5:
        pxVar5 = (xmlRelaxNGParserCtxtPtr)
                 xmlRelaxNGTryUnlink((xmlRelaxNGParserCtxtPtr)cur,parent,
                                     (xmlRelaxNGDefinePtr_conflict)parent_00,
                                     (xmlRelaxNGDefinePtr_conflict)in_RCX);
      }
    }
    else if (xVar2 == XML_RELAXNG_NOT_ALLOWED) {
      ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
LAB_00174906:
      pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
      if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
         (xVar2 = parent->type, (uint)xVar2 < 0x14)) {
        if (xVar2 == XML_RELAXNG_CHOICE) goto LAB_00174ab5;
        in_RCX = (xmlRelaxNGParserCtxtPtr)0xd8300;
        if ((0xd8300U >> (xVar2 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0) {
          xVar2 = XML_RELAXNG_NOT_ALLOWED;
          goto LAB_00174adb;
        }
      }
    }
    else {
      if ((xVar2 == XML_RELAXNG_PARENTREF) || (xVar2 == XML_RELAXNG_REF)) {
        pxVar5 = parent_00;
        if ((short)((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves != -3) {
          *(short *)&((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves = -3;
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
        }
        goto LAB_00174acb;
      }
      ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
      if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar !=
          (xmlRelaxNGDefinePtr_conflict)0x0) {
        xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
        xVar2 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
      }
      if ((xVar2 != XML_RELAXNG_VALUE) &&
         (*(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings !=
          (xmlRelaxNGDefinePtr_conflict)0x0)) {
        xmlRelaxNGSimplify(ctxt,*(xmlRelaxNGDefinePtr_conflict *)
                                 &((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings,cur);
      }
      if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->define !=
          (xmlRelaxNGDefinePtr_conflict)0x0) {
        xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->define
                           ,cur);
      }
      xVar2 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
      if (xVar2 == XML_RELAXNG_ELEMENT) {
        pxVar6 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
        while (pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0) {
          iVar3 = xmlRelaxNGGenerateAttributes(ctxt,pxVar6);
          def = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          if (iVar3 != 1) goto LAB_001749e7;
          pxVar6 = def->next;
          ((xmlRelaxNGParserCtxtPtr)cur)->grammar = (xmlRelaxNGGrammarPtr_conflict)pxVar6;
          def->next = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
          *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings = def;
        }
        def = (xmlRelaxNGDefinePtr_conflict)0x0;
LAB_001749e7:
        while ((pxVar6 = def, pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
               (def = pxVar6->next, def != (xmlRelaxNGDefinePtr_conflict)0x0))) {
          iVar3 = xmlRelaxNGGenerateAttributes(ctxt,def);
          if (iVar3 == 1) {
            pxVar6->next = def->next;
            def->next = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
            *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings = def;
            def = pxVar6;
          }
        }
        xVar2 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
      }
      in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)(uint)(xVar2 & ~XML_RELAXNG_NOT_ALLOWED);
      if ((xVar2 & ~XML_RELAXNG_NOT_ALLOWED) == XML_RELAXNG_GROUP) {
        pxVar4 = (xmlRelaxNGParserCtxtPtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
        if (pxVar4 != (xmlRelaxNGParserCtxtPtr)0x0) {
          if (*(xmlRelaxNGDefinePtr *)&pxVar4->flags == (xmlRelaxNGDefinePtr)0x0) {
            if (parent == (xmlRelaxNGDefinePtr_conflict)0x0 &&
                parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
              *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_NOOP;
              in_RCX = (xmlRelaxNGParserCtxtPtr)0x0;
              goto LAB_00174acb;
            }
            if (parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
              parent->content = (xmlRelaxNGDefinePtr)pxVar4;
              in_RCX = (xmlRelaxNGParserCtxtPtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
              pxVar4 = *(xmlRelaxNGParserCtxtPtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
              cur = (xmlRelaxNGDefinePtr_conflict)in_RCX;
            }
            else {
              *(xmlRelaxNGDefinePtr *)&pxVar4->flags =
                   *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
              in_RCX = parent_00;
              cur = (xmlRelaxNGDefinePtr_conflict)pxVar4;
            }
            *(xmlRelaxNGParserCtxtPtr *)&in_RCX->flags = pxVar4;
          }
          xVar2 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
          pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
          goto LAB_00174a7c;
        }
        *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_EMPTY;
      }
      else {
LAB_00174a7c:
        cur = (xmlRelaxNGDefinePtr_conflict)pxVar5;
        if (xVar2 != XML_RELAXNG_EMPTY) {
          if (xVar2 != XML_RELAXNG_NOT_ALLOWED) {
            if (((xVar2 == XML_RELAXNG_EXCEPT) &&
                ((xmlRelaxNGDefinePtr)pxVar5->grammar != (xmlRelaxNGDefinePtr)0x0)) &&
               (((xmlRelaxNGDefinePtr)pxVar5->grammar)->type == XML_RELAXNG_NOT_ALLOWED))
            goto LAB_00174ab5;
            goto LAB_00174acb;
          }
          goto LAB_00174906;
        }
      }
      pxVar5 = (xmlRelaxNGParserCtxtPtr)cur;
      if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
        uVar1 = parent->type + ~XML_RELAXNG_OPTIONAL;
        in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)uVar1;
        if (uVar1 < 2) goto LAB_00174ad9;
        if ((uint)(parent->type + ~XML_RELAXNG_ONEORMORE) < 3) goto LAB_00174ab5;
      }
    }
LAB_00174acb:
    cur = *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
    parent_00 = pxVar5;
  } while( true );
}

Assistant:

static void
xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,
                   xmlRelaxNGDefinePtr cur, xmlRelaxNGDefinePtr parent)
{
    xmlRelaxNGDefinePtr prev = NULL;

    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth != -3) {
                cur->depth = -3;
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            }
        } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                 (parent->type == XML_RELAXNG_LIST) ||
                 (parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE) ||
                 (parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_NOT_ALLOWED;
                break;
            }
            if ((parent != NULL) && (parent->type == XML_RELAXNG_CHOICE)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else if (cur->type == XML_RELAXNG_EMPTY) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_EMPTY;
                break;
            }
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE))) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else {
            cur->parent = parent;
            if (cur->content != NULL)
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            if ((cur->type != XML_RELAXNG_VALUE) && (cur->attrs != NULL))
                xmlRelaxNGSimplify(ctxt, cur->attrs, cur);
            if (cur->nameClass != NULL)
                xmlRelaxNGSimplify(ctxt, cur->nameClass, cur);
            /*
             * On Elements, try to move attribute only generating rules on
             * the attrs rules.
             */
            if (cur->type == XML_RELAXNG_ELEMENT) {
                int attronly;
                xmlRelaxNGDefinePtr tmp, pre;

                while (cur->content != NULL) {
                    attronly =
                        xmlRelaxNGGenerateAttributes(ctxt, cur->content);
                    if (attronly == 1) {
                        /*
                         * migrate cur->content to attrs
                         */
                        tmp = cur->content;
                        cur->content = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        /*
                         * cur->content can generate elements or text
                         */
                        break;
                    }
                }
                pre = cur->content;
                while ((pre != NULL) && (pre->next != NULL)) {
                    tmp = pre->next;
                    attronly = xmlRelaxNGGenerateAttributes(ctxt, tmp);
                    if (attronly == 1) {
                        /*
                         * migrate tmp to attrs
                         */
                        pre->next = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        pre = tmp;
                    }
                }
            }
            /*
             * This may result in a simplification
             */
            if ((cur->type == XML_RELAXNG_GROUP) ||
                (cur->type == XML_RELAXNG_INTERLEAVE)) {
                if (cur->content == NULL)
                    cur->type = XML_RELAXNG_EMPTY;
                else if (cur->content->next == NULL) {
                    if ((parent == NULL) && (prev == NULL)) {
                        cur->type = XML_RELAXNG_NOOP;
                    } else if (prev == NULL) {
                        parent->content = cur->content;
                        cur->content->next = cur->next;
                        cur = cur->content;
                    } else {
                        cur->content->next = cur->next;
                        prev->next = cur->content;
                        cur = cur->content;
                    }
                }
            }
            /*
             * the current node may have been transformed back
             */
            if ((cur->type == XML_RELAXNG_EXCEPT) &&
                (cur->content != NULL) &&
                (cur->content->type == XML_RELAXNG_NOT_ALLOWED)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                     (parent->type == XML_RELAXNG_LIST) ||
                     (parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_NOT_ALLOWED;
                    break;
                }
                if ((parent != NULL) &&
                    (parent->type == XML_RELAXNG_CHOICE)) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else if (cur->type == XML_RELAXNG_EMPTY) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_EMPTY;
                    break;
                }
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_CHOICE))) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else {
                prev = cur;
            }
        }
        cur = cur->next;
    }
}